

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duck_transaction_manager.cpp
# Opt level: O1

void __thiscall
duckdb::DuckTransactionManager::Checkpoint
          (DuckTransactionManager *this,ClientContext *context,bool force)

{
  AttachedDatabase *db;
  StorageLockKey *this_00;
  _Alloc_hider _Var1;
  bool bVar2;
  int iVar3;
  StorageManager *this_01;
  MetaTransaction *this_02;
  InterruptException *this_03;
  TransactionException *pTVar4;
  pointer *__ptr;
  unique_ptr<duckdb::StorageLockKey,_std::default_delete<duckdb::StorageLockKey>,_true> lock;
  optional_ptr<duckdb::Transaction,_true> current;
  StorageLockKey *local_68;
  string local_60;
  pthread_mutex_t *local_40;
  optional_ptr<duckdb::Transaction,_true> local_38;
  
  this_01 = AttachedDatabase::GetStorageManager((this->super_TransactionManager).db);
  bVar2 = StorageManager::InMemory(this_01);
  if (!bVar2) {
    db = (this->super_TransactionManager).db;
    this_02 = TransactionContext::ActiveTransaction(&context->transaction);
    local_38 = MetaTransaction::TryGetTransaction(this_02,db);
    if (local_38.ptr != (Transaction *)0x0) {
      if (force) {
        pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "Cannot FORCE CHECKPOINT: the current transaction has been started for this database"
                   ,"");
        TransactionException::TransactionException(pTVar4,&local_60);
        __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
      optional_ptr<duckdb::Transaction,_true>::CheckValid(&local_38);
      bVar2 = DuckTransaction::ChangesMade((DuckTransaction *)local_38.ptr);
      if (bVar2) {
        pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "Cannot CHECKPOINT: the current transaction has transaction local changes","");
        TransactionException::TransactionException(pTVar4,&local_60);
        __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    local_68 = (StorageLockKey *)0x0;
    if (force) {
      local_40 = (pthread_mutex_t *)&this->start_transaction_lock;
      iVar3 = pthread_mutex_lock(local_40);
      if (iVar3 != 0) {
        ::std::__throw_system_error(iVar3);
      }
      do {
        this_00 = local_68;
        if (((context->interrupted)._M_base._M_i & 1U) != 0) {
          this_03 = (InterruptException *)__cxa_allocate_exception(0x10);
          InterruptException::InterruptException(this_03);
          __cxa_throw(this_03,&InterruptException::typeinfo,::std::runtime_error::~runtime_error);
        }
        StorageLock::TryGetExclusiveLock((StorageLock *)&local_60);
        local_68 = (StorageLockKey *)local_60._M_dataplus._M_p;
        local_60._M_dataplus._M_p = (pointer)0x0;
        if (this_00 != (StorageLockKey *)0x0) {
          StorageLockKey::~StorageLockKey(this_00);
          operator_delete(this_00);
        }
        _Var1._M_p = local_60._M_dataplus._M_p;
        if ((StorageLockKey *)local_60._M_dataplus._M_p != (StorageLockKey *)0x0) {
          StorageLockKey::~StorageLockKey((StorageLockKey *)local_60._M_dataplus._M_p);
          operator_delete(_Var1._M_p);
        }
      } while (local_68 == (StorageLockKey *)0x0);
      pthread_mutex_unlock(local_40);
    }
    else {
      StorageLock::TryGetExclusiveLock((StorageLock *)&local_60);
      _Var1._M_p = local_60._M_dataplus._M_p;
      local_68 = (StorageLockKey *)local_60._M_dataplus._M_p;
      local_60._M_dataplus._M_p = (pointer)0x0;
      if ((StorageLockKey *)_Var1._M_p == (StorageLockKey *)0x0) {
        pTVar4 = (TransactionException *)__cxa_allocate_exception(0x10);
        local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_60,
                   "Cannot CHECKPOINT: there are other write transactions active. Try using FORCE CHECKPOINT to wait until all active transactions are finished"
                   ,"");
        TransactionException::TransactionException(pTVar4,&local_60);
        __cxa_throw(pTVar4,&TransactionException::typeinfo,::std::runtime_error::~runtime_error);
      }
    }
    (*this_01->_vptr_StorageManager[5])
              (this_01,context,1,
               (ulong)((this->lowest_active_start).super___atomic_base<unsigned_long>._M_i <
                      (this->last_commit).super___atomic_base<unsigned_long>._M_i));
    if (local_68 != (StorageLockKey *)0x0) {
      StorageLockKey::~StorageLockKey(local_68);
      operator_delete(local_68);
    }
  }
  return;
}

Assistant:

void DuckTransactionManager::Checkpoint(ClientContext &context, bool force) {
	auto &storage_manager = db.GetStorageManager();
	if (storage_manager.InMemory()) {
		return;
	}

	auto current = Transaction::TryGet(context, db);
	if (current) {
		if (force) {
			throw TransactionException(
			    "Cannot FORCE CHECKPOINT: the current transaction has been started for this database");
		} else {
			auto &duck_transaction = current->Cast<DuckTransaction>();
			if (duck_transaction.ChangesMade()) {
				throw TransactionException("Cannot CHECKPOINT: the current transaction has transaction local changes");
			}
		}
	}

	unique_ptr<StorageLockKey> lock;
	if (!force) {
		// not a force checkpoint
		// try to get the checkpoint lock
		lock = checkpoint_lock.TryGetExclusiveLock();
		if (!lock) {
			// we could not manage to get the lock - cancel
			throw TransactionException("Cannot CHECKPOINT: there are other write transactions active. Try using FORCE "
			                           "CHECKPOINT to wait until all active transactions are finished");
		}

	} else {
		// force checkpoint - wait to get an exclusive lock
		// grab the start_transaction_lock to prevent new transactions from starting
		lock_guard<mutex> start_lock(start_transaction_lock);
		// wait until any active transactions are finished
		while (!lock) {
			if (context.interrupted) {
				throw InterruptException();
			}
			lock = checkpoint_lock.TryGetExclusiveLock();
		}
	}
	CheckpointOptions options;
	if (GetLastCommit() > LowestActiveStart()) {
		// we cannot do a full checkpoint if any transaction needs to read old data
		options.type = CheckpointType::CONCURRENT_CHECKPOINT;
	}
	storage_manager.CreateCheckpoint(context, options);
}